

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BinaryExpression.cpp
# Opt level: O2

string * __thiscall
ninx::parser::element::BinaryExpression::dump_abi_cxx11_
          (string *__return_storage_ptr__,BinaryExpression *this,int level)

{
  Expression *pEVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
  std::__cxx11::string::_M_construct((ulong)&local_118,(char)level);
  (*(this->super_Expression).super_Statement.super_ASTElement._vptr_ASTElement[7])(&local_b8,this);
  std::operator+(&local_98,&local_118,&local_b8);
  std::operator+(&local_78,&local_98,": ");
  pEVar1 = (this->first)._M_t.
           super___uniq_ptr_impl<ninx::parser::element::Expression,_std::default_delete<ninx::parser::element::Expression>_>
           ._M_t.
           super__Tuple_impl<0UL,_ninx::parser::element::Expression_*,_std::default_delete<ninx::parser::element::Expression>_>
           .super__Head_base<0UL,_ninx::parser::element::Expression_*,_false>._M_head_impl;
  (**(code **)(*(long *)&(pEVar1->super_Statement).super_ASTElement + 0x18))(&local_d8,pEVar1,level)
  ;
  std::operator+(&local_58,&local_78,&local_d8);
  std::operator+(&local_38,&local_58," + ");
  pEVar1 = (this->second)._M_t.
           super___uniq_ptr_impl<ninx::parser::element::Expression,_std::default_delete<ninx::parser::element::Expression>_>
           ._M_t.
           super__Tuple_impl<0UL,_ninx::parser::element::Expression_*,_std::default_delete<ninx::parser::element::Expression>_>
           .super__Head_base<0UL,_ninx::parser::element::Expression_*,_false>._M_head_impl;
  (**(code **)(*(long *)&(pEVar1->super_Statement).super_ASTElement + 0x18))(&local_f8,pEVar1,level)
  ;
  std::operator+(__return_storage_ptr__,&local_38,&local_f8);
  std::__cxx11::string::~string((string *)&local_f8);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_d8);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&local_b8);
  std::__cxx11::string::~string((string *)&local_118);
  return __return_storage_ptr__;
}

Assistant:

std::string ninx::parser::element::BinaryExpression::dump(int level) const {
    return std::string(level, '\t')+ get_dump_name() + ": "+first->dump(level)+" + "+second->dump(level);
}